

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

Constraint *
slang::ast::DisableSoftConstraint::fromSyntax(DisableConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *__addr;
  bool bVar1;
  int iVar2;
  RandMode RVar3;
  NameSyntax *pNVar4;
  undefined4 extraout_var;
  DisableConstraintSyntax *ctrl;
  Symbol *symbol;
  Symbol *sym;
  DisableSoftConstraint *result;
  Expression *local_30;
  Expression *expr;
  Compilation *comp;
  ASTContext *context_local;
  DisableConstraintSyntax *syntax_local;
  
  comp = (Compilation *)context;
  context_local = (ASTContext *)syntax;
  expr = (Expression *)ASTContext::getCompilation(context);
  pNVar4 = not_null<slang::syntax::NameSyntax_*>::operator*
                     ((not_null<slang::syntax::NameSyntax_*> *)&context_local->assertionInstance);
  __addr = comp;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&result,None);
  iVar2 = Expression::bind((int)pNVar4,(sockaddr *)__addr,(socklen_t)result);
  local_30 = (Expression *)CONCAT44(extraout_var,iVar2);
  ctrl = (DisableConstraintSyntax *)
         BumpAllocator::emplace<slang::ast::DisableSoftConstraint,slang::ast::Expression_const&>
                   ((BumpAllocator *)expr,local_30);
  bVar1 = Expression::bad(local_30);
  if (bVar1) {
    syntax_local = (DisableConstraintSyntax *)
                   Constraint::badConstraint((Compilation *)expr,(Constraint *)ctrl);
  }
  else {
    symbol = Expression::getSymbolReference(local_30,true);
    if ((symbol == (Symbol *)0x0) ||
       (RVar3 = ASTContext::getRandMode((ASTContext *)comp,symbol), syntax_local = ctrl,
       RVar3 != Rand)) {
      ASTContext::addDiag((ASTContext *)comp,(DiagCode)0x20008,local_30->sourceRange);
      syntax_local = (DisableConstraintSyntax *)
                     Constraint::badConstraint((Compilation *)expr,(Constraint *)ctrl);
    }
  }
  return (Constraint *)syntax_local;
}

Assistant:

Constraint& DisableSoftConstraint::fromSyntax(const DisableConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = Expression::bind(*syntax.name, context);
    auto result = comp.emplace<DisableSoftConstraint>(expr);
    if (expr.bad())
        return badConstraint(comp, result);

    auto sym = expr.getSymbolReference();
    if (!sym || context.getRandMode(*sym) != RandMode::Rand) {
        context.addDiag(diag::BadDisableSoft, expr.sourceRange);
        return badConstraint(comp, result);
    }

    return *result;
}